

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

int __thiscall
JsUtil::
BaseDictionary<FuncInfo::SlotKey,unsigned_short,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,FuncInfo::SlotKeyComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
::
Insert<(JsUtil::BaseDictionary<FuncInfo::SlotKey,unsigned_short,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,FuncInfo::SlotKeyComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
          (BaseDictionary<FuncInfo::SlotKey,unsigned_short,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,FuncInfo::SlotKeyComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
           *this,SlotKey *key,unsigned_short *value)

{
  BaseDictionary<FuncInfo::SlotKey,unsigned_short,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,FuncInfo::SlotKeyComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
  *pBVar1;
  hash_t hashCode;
  undefined8 *puVar2;
  long lVar3;
  code *pcVar4;
  long lVar5;
  char cVar6;
  undefined8 uVar7;
  bool bVar8;
  uint uVar9;
  int iVar10;
  undefined4 *puVar11;
  uint depth;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  int iVar15;
  
  lVar14 = *(long *)this;
  if (lVar14 == 0) {
    BaseDictionary<FuncInfo::SlotKey,_unsigned_short,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_FuncInfo::SlotKeyComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::Initialize((BaseDictionary<FuncInfo::SlotKey,_unsigned_short,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_FuncInfo::SlotKeyComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                  *)this,0);
    lVar14 = *(long *)this;
  }
  hashCode = (key->slot & 0xfU | *(uint *)&key->scope) * 2 + 1;
  uVar9 = BaseDictionary<FuncInfo::SlotKey,_unsigned_short,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_FuncInfo::SlotKeyComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::GetBucket(hashCode,*(int *)(this + 0x1c),*(int *)(this + 0x2c));
  uVar13 = *(uint *)(lVar14 + (ulong)uVar9 * 4);
  if ((int)uVar13 < 0) {
    cVar6 = (char)(uVar13 >> 0x18);
    depth = 0;
  }
  else {
    lVar14 = *(long *)(this + 8);
    depth = 0;
    do {
      uVar12 = (ulong)uVar13;
      if ((*(Scope **)(lVar14 + 8 + uVar12 * 0x18) == key->scope) &&
         (*(int *)(lVar14 + 0x10 + uVar12 * 0x18) == key->slot)) {
        if (*(DictionaryStats **)(this + 0x30) != (DictionaryStats *)0x0) {
          DictionaryStats::Lookup(*(DictionaryStats **)(this + 0x30),depth);
        }
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar11 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                           ,0x3b2,"(op != Insert_Add)","op != Insert_Add");
        if (bVar8) {
          *puVar11 = 0;
          return -1;
        }
        goto LAB_0082aee1;
      }
      depth = depth + 1;
      uVar13 = *(uint *)(lVar14 + uVar12 * 0x18 + 4);
    } while (-1 < (int)uVar13);
    cVar6 = (char)(uVar13 >> 0x18);
  }
  if (*(DictionaryStats **)(this + 0x30) != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(*(DictionaryStats **)(this + 0x30),depth);
  }
  iVar15 = -1;
  if (cVar6 < '\0') {
    if (*(int *)(this + 0x28) == 0) {
      iVar15 = *(int *)(this + 0x20);
      if (iVar15 == *(int *)(this + 0x18)) {
        BaseDictionary<FuncInfo::SlotKey,_unsigned_short,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_FuncInfo::SlotKeyComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
        ::Resize((BaseDictionary<FuncInfo::SlotKey,_unsigned_short,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_FuncInfo::SlotKeyComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                  *)this);
        uVar9 = BaseDictionary<FuncInfo::SlotKey,_unsigned_short,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_FuncInfo::SlotKeyComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                ::GetBucket(hashCode,*(int *)(this + 0x1c),*(int *)(this + 0x2c));
        iVar15 = *(int *)(this + 0x20);
      }
      *(int *)(this + 0x20) = iVar15 + 1;
      if (*(int *)(this + 0x18) < iVar15 + 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar11 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                           ,0x3f1,"(count <= size)","count <= size");
        if (!bVar8) goto LAB_0082aee1;
        *puVar11 = 0;
      }
      if (*(int *)(this + 0x18) <= iVar15) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar11 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                           ,0x3f2,"(index < size)","index < size");
        if (!bVar8) goto LAB_0082aee1;
        *puVar11 = 0;
      }
    }
    else {
      if (*(int *)(this + 0x28) < 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar11 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                           ,0x3d4,"(freeCount > 0)","freeCount > 0");
        if (!bVar8) goto LAB_0082aee1;
        *puVar11 = 0;
      }
      if (*(int *)(this + 0x24) < 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar11 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                           ,0x3d5,"(freeList >= 0)","freeList >= 0");
        if (!bVar8) goto LAB_0082aee1;
        *puVar11 = 0;
      }
      if (*(int *)(this + 0x20) <= *(int *)(this + 0x24)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar11 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                           ,0x3d6,"(freeList < count)","freeList < count");
        if (!bVar8) {
LAB_0082aee1:
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        *puVar11 = 0;
      }
      iVar15 = *(int *)(this + 0x24);
      pBVar1 = this + 0x28;
      *(int *)pBVar1 = *(int *)pBVar1 + -1;
      if (*(int *)pBVar1 != 0) {
        iVar10 = BaseDictionary<FuncInfo::SlotKey,_unsigned_short,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_FuncInfo::SlotKeyComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                 ::GetNextFreeEntryIndex((EntryType *)((long)iVar15 * 0x18 + *(long *)(this + 8)));
        *(int *)(this + 0x24) = iVar10;
      }
    }
    lVar14 = *(long *)(this + 8);
    lVar5 = (long)iVar15 * 0x18;
    *(unsigned_short *)(lVar14 + lVar5) = *value;
    uVar7 = *(undefined8 *)&key->slot;
    puVar2 = (undefined8 *)(lVar14 + 8 + lVar5);
    *puVar2 = key->scope;
    puVar2[1] = uVar7;
    lVar14 = *(long *)this;
    lVar3 = *(long *)(this + 8);
    *(undefined4 *)(lVar3 + 4 + lVar5) = *(undefined4 *)(lVar14 + (ulong)uVar9 * 4);
    *(int *)(lVar14 + (ulong)uVar9 * 4) = iVar15;
    uVar9 = 0;
    iVar10 = iVar15;
    do {
      iVar10 = *(int *)(lVar3 + 4 + (long)iVar10 * 0x18);
      uVar9 = uVar9 + 1;
    } while (iVar10 != -1);
    if (*(DictionaryStats **)(this + 0x30) != (DictionaryStats *)0x0) {
      DictionaryStats::Insert(*(DictionaryStats **)(this + 0x30),uVar9);
    }
  }
  return iVar15;
}

Assistant:

int Insert(const TKey& key, const TValue& value)
        {
            int * localBuckets = buckets;
            if (localBuckets == nullptr)
            {
                Initialize(0);
                localBuckets = buckets;
            }

#if DBG || PROFILE_DICTIONARY
            // Always search and verify
            const bool needSearch = true;
#else
            const bool needSearch = (op != Insert_Add);
#endif
            hash_t hashCode = GetHashCode(key);
            uint targetBucket = this->GetBucket(hashCode);
            if (needSearch)
            {
#if PROFILE_DICTIONARY
                uint depth = 0;
#endif
                EntryType * localEntries = entries;
                for (int i = localBuckets[targetBucket]; i >= 0; i = localEntries[i].next)
                {
                    if (localEntries[i].template KeyEquals<Comparer<TKey>>(key, hashCode))
                    {
#if PROFILE_DICTIONARY
                        if (stats)
                            stats->Lookup(depth);
#endif
                        Assert(op != Insert_Add);
                        if (op == Insert_Item)
                        {
                            localEntries[i].SetValue(value);
                            return i;
                        }
                        return -1;
                    }
#if PROFILE_DICTIONARY
                    depth += 1;
#endif
                }

#if PROFILE_DICTIONARY
                if (stats)
                    stats->Lookup(depth);
#endif
            }

            // Ideally we'd do cleanup only if weak references have been collected since the last resize
            // but that would require us to use an additional field to store the last recycler cleanup id
            // that we saw
            // We can add that optimization later if we have to.
            if (EntryType::SupportsCleanup() && freeCount == 0 && count == size)
            {
                this->MapAndRemoveIf([](EntryType& entry)
                {
                    return EntryType::NeedsCleanup(entry);
                });
            }

            int index;
            if (freeCount != 0)
            {
                Assert(freeCount > 0);
                Assert(freeList >= 0);
                Assert(freeList < count);
                index = freeList;
                freeCount--;
                if(freeCount != 0)
                {
                    freeList = GetNextFreeEntryIndex(entries[index]);
                }
            }
            else
            {
                // If there's nothing free, then in general, we set index to count, and increment count
                // If we resize, we also need to recalculate the target
                // However, if cleanup is supported, then before resize, we should try and clean up and see
                // if something got freed, and if it did, reuse that index
                if (count == size)
                {
                    Resize();
                    targetBucket = this->GetBucket(hashCode);
                    index = count;
                    count++;
                }
                else
                {
                    index = count;
                    count++;
                }

                Assert(count <= size);
                Assert(index < size);
            }

            entries[index].Set(key, value, hashCode);
            entries[index].next = buckets[targetBucket];
            buckets[targetBucket] = index;

#if PROFILE_DICTIONARY
            int profileIndex = index;
            uint depth = 1;  // need to recalculate depth in case there was a resize (also 1-based for stats->Insert)
            while(entries[profileIndex].next != -1)
            {
                profileIndex = entries[profileIndex].next;
                ++depth;
            }
            if (stats)
                stats->Insert(depth);
#endif
            return index;
        }